

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

int WriteOptionString(TidyOptionImpl *option,ctmbstr sval,StreamOut *out)

{
  int extraout_EAX;
  uint c;
  char *pcVar1;
  
  for (pcVar1 = option->name; *pcVar1 != '\0'; pcVar1 = pcVar1 + 1) {
    prvTidyWriteChar((int)*pcVar1,out);
  }
  prvTidyWriteChar(0x3a,out);
  c = 0x20;
  do {
    prvTidyWriteChar(c,out);
    c = (uint)*sval;
    sval = sval + 1;
  } while (c != 0);
  prvTidyWriteChar(10,out);
  return extraout_EAX;
}

Assistant:

static int  WriteOptionString( const TidyOptionImpl* option,
                               ctmbstr sval, StreamOut* out )
{
  ctmbstr cp = option->name;
  while ( *cp )
      TY_(WriteChar)( *cp++, out );
  TY_(WriteChar)( ':', out );
  TY_(WriteChar)( ' ', out );
  cp = sval;
  while ( *cp )
      TY_(WriteChar)( *cp++, out );
  TY_(WriteChar)( '\n', out );
  return 0;
}